

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O3

void clip_component(opj_image_comp_t *component,OPJ_UINT32 precision)

{
  OPJ_INT32 *pOVar1;
  long lVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  
  lVar2 = (ulong)component->h * (ulong)component->w;
  uVar3 = ~(-1 << ((byte)precision & 0x1f));
  if (0x1f < precision) {
    uVar3 = 0xffffffff;
  }
  pOVar1 = component->data;
  if (component->sgnd == 0) {
    if (lVar2 != 0) {
      lVar4 = 0;
      do {
        if (uVar3 < (uint)pOVar1[lVar4]) {
          pOVar1[lVar4] = uVar3;
        }
        lVar4 = lVar4 + 1;
      } while (lVar2 - lVar4 != 0);
    }
  }
  else if (lVar2 != 0) {
    uVar3 = uVar3 >> 1;
    lVar4 = 0;
    do {
      uVar5 = uVar3;
      if (((int)uVar3 < pOVar1[lVar4]) || (uVar5 = ~uVar3, pOVar1[lVar4] < (int)~uVar3)) {
        pOVar1[lVar4] = uVar5;
      }
      lVar4 = lVar4 + 1;
    } while (lVar2 - lVar4 != 0);
  }
  component->prec = precision;
  return;
}

Assistant:

void clip_component(opj_image_comp_t* component, OPJ_UINT32 precision)
{
	OPJ_SIZE_T i;
	OPJ_SIZE_T len;
	OPJ_UINT32 umax = (OPJ_UINT32)((OPJ_INT32)-1);
	
	len = (OPJ_SIZE_T)component->w * (OPJ_SIZE_T)component->h;
	if (precision < 32) {
		umax = (1U << precision) - 1U;
	}
	
	if (component->sgnd) {
		OPJ_INT32* l_data = component->data;
		OPJ_INT32 max = (OPJ_INT32)(umax / 2U);
		OPJ_INT32 min = -max - 1;
		for (i = 0; i < len; ++i) {
			if (l_data[i] > max) {
				l_data[i] = max;
			} else if (l_data[i] < min) {
				l_data[i] = min;
			}
		}
	} else {
		OPJ_UINT32* l_data = (OPJ_UINT32*)component->data;
		for (i = 0; i < len; ++i) {
			if (l_data[i] > umax) {
				l_data[i] = umax;
			}
		}
	}
	component->prec = precision;
}